

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

int rnd_pcg_range(rnd_pcg_t *pcg,int min,int max)

{
  int iVar1;
  float fVar2;
  int value;
  int range;
  int max_local;
  int min_local;
  rnd_pcg_t *pcg_local;
  
  iVar1 = (max - min) + 1;
  pcg_local._4_4_ = min;
  if (0 < iVar1) {
    fVar2 = rnd_pcg_nextf(pcg);
    pcg_local._4_4_ = min + (int)(fVar2 * (float)iVar1);
  }
  return pcg_local._4_4_;
}

Assistant:

int rnd_pcg_range( rnd_pcg_t* pcg, int min, int max )
    {
    int const range = ( max - min ) + 1;
    if( range <= 0 ) return min;
    int const value = (int) ( rnd_pcg_nextf( pcg ) * range );
    return min + value; 
    }